

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::ExpectationBase::DescribeLocationTo(ExpectationBase *this,ostream *os)

{
  ostream *poVar1;
  int in_ECX;
  string local_30;
  
  FormatFileLocation_abi_cxx11_
            (&local_30,(internal *)this->file_,(char *)(ulong)(uint)this->line_,in_ECX);
  poVar1 = std::operator<<(os,(string *)&local_30);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void DescribeLocationTo(::std::ostream* os) const {
    *os << FormatFileLocation(file(), line()) << " ";
  }